

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::findNextFCDBoundary(Normalizer2Impl *this,UChar *p,UChar *limit)

{
  UChar UVar1;
  uint16_t norm16;
  UBool UVar2;
  int iVar3;
  UCPTrie *trie;
  uint c;
  UChar *pUVar4;
  
  do {
    if (limit <= p) {
      return p;
    }
    pUVar4 = p + 1;
    UVar1 = *p;
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 == limit | (byte)((ushort)UVar1 >> 10) & 1) == 1) {
        trie = this->normTrie;
      }
      else {
        UVar1 = *pUVar4;
        trie = this->normTrie;
        if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
          pUVar4 = p + 2;
          c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar3 = ucptrie_internalSmallIndex_63(trie,c);
            trie = this->normTrie;
          }
          else {
            iVar3 = trie->dataLength + -2;
          }
          goto LAB_00297d4b;
        }
      }
      iVar3 = trie->dataLength + -1;
    }
    else {
      trie = this->normTrie;
      iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
LAB_00297d4b:
    if (c < (ushort)this->minLcccCP) {
      return p;
    }
    norm16 = *(uint16_t *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
    UVar2 = norm16HasDecompBoundaryBefore(this,norm16);
    if (UVar2 != '\0') {
      return p;
    }
    UVar2 = norm16HasDecompBoundaryAfter(this,norm16);
    p = pUVar4;
    if (UVar2 != '\0') {
      return pUVar4;
    }
  } while( true );
}

Assistant:

const UChar *Normalizer2Impl::findNextFCDBoundary(const UChar *p, const UChar *limit) const {
    while(p<limit) {
        const UChar *codePointStart=p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if (c < minLcccCP || norm16HasDecompBoundaryBefore(norm16)) {
            return codePointStart;
        }
        if (norm16HasDecompBoundaryAfter(norm16)) {
            return p;
        }
    }
    return p;
}